

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkv_interface.cpp
# Opt level: O1

void __thiscall MkvInterface::handleInfo(MkvInterface *this)

{
  int *UpperLevel;
  EbmlElement **this_00;
  EbmlStream *pEVar1;
  int iVar2;
  undefined4 extraout_var;
  EbmlElement *pEVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  
  pEVar1 = this->aStream;
  iVar2 = (*this->m_element1->_vptr_EbmlElement[4])();
  UpperLevel = &this->m_upperElementa;
  pEVar3 = libebml::EbmlStream::FindNextElement
                     (pEVar1,*(EbmlSemanticContext **)(CONCAT44(extraout_var,iVar2) + 0x18),
                      UpperLevel,0xffffffff,this->m_allowDummy,1);
  this->m_element2a = pEVar3;
  if ((pEVar3 != (EbmlElement *)0x0) && (iVar2 = this->m_upperElementa, iVar2 < 1)) {
    this_00 = &this->m_element2a;
    do {
      if (iVar2 < 0) {
        *UpperLevel = 0;
      }
      if (this->m_verbose == true) {
        handleInfo((MkvInterface *)this_00);
      }
      iVar2 = (*(*this_00)->_vptr_EbmlElement[3])();
      if ((*(long *)(libmatroska::KaxTimecodeScale::ClassInfos._8_8_ + 8) ==
           *(long *)((int *)CONCAT44(extraout_var_00,iVar2) + 2)) &&
         (*(int *)libmatroska::KaxTimecodeScale::ClassInfos._8_8_ ==
          *(int *)CONCAT44(extraout_var_00,iVar2))) {
        handleInfo();
      }
      else {
        iVar2 = (*(*this_00)->_vptr_EbmlElement[3])(*this_00);
        if ((*(long *)(libmatroska::KaxDuration::ClassInfos._8_8_ + 8) ==
             *(long *)((int *)CONCAT44(extraout_var_01,iVar2) + 2)) &&
           (*(int *)libmatroska::KaxDuration::ClassInfos._8_8_ ==
            *(int *)CONCAT44(extraout_var_01,iVar2))) {
          handleInfo();
        }
        else {
          iVar2 = (*(*this_00)->_vptr_EbmlElement[3])(*this_00);
          if ((*(long *)(libmatroska::KaxDateUTC::ClassInfos._8_8_ + 8) ==
               *(long *)((int *)CONCAT44(extraout_var_02,iVar2) + 2)) &&
             (*(int *)libmatroska::KaxDateUTC::ClassInfos._8_8_ ==
              *(int *)CONCAT44(extraout_var_02,iVar2))) {
            handleInfo();
          }
          else {
            iVar2 = (*(*this_00)->_vptr_EbmlElement[3])();
            if ((*(long *)(libmatroska::KaxSegmentFilename::ClassInfos._8_8_ + 8) ==
                 *(long *)((int *)CONCAT44(extraout_var_03,iVar2) + 2)) &&
               (*(int *)libmatroska::KaxSegmentFilename::ClassInfos._8_8_ ==
                *(int *)CONCAT44(extraout_var_03,iVar2))) {
              handleInfo();
            }
            else {
              iVar2 = (*(*this_00)->_vptr_EbmlElement[3])(*this_00);
              if ((*(long *)(libmatroska::KaxMuxingApp::ClassInfos._8_8_ + 8) ==
                   *(long *)((int *)CONCAT44(extraout_var_04,iVar2) + 2)) &&
                 (*(int *)libmatroska::KaxMuxingApp::ClassInfos._8_8_ ==
                  *(int *)CONCAT44(extraout_var_04,iVar2))) {
                handleInfo();
              }
              else {
                iVar2 = (*(*this_00)->_vptr_EbmlElement[3])(*this_00);
                if ((*(long *)(libmatroska::KaxWritingApp::ClassInfos._8_8_ + 8) ==
                     *(long *)((int *)CONCAT44(extraout_var_05,iVar2) + 2)) &&
                   (*(int *)libmatroska::KaxWritingApp::ClassInfos._8_8_ ==
                    *(int *)CONCAT44(extraout_var_05,iVar2))) {
                  handleInfo();
                }
                else {
                  handleInfo();
                }
              }
            }
          }
        }
      }
      if (*UpperLevel < 1) {
        pEVar3 = *this_00;
        pEVar1 = this->aStream;
        iVar2 = (*pEVar3->_vptr_EbmlElement[4])(pEVar3);
        libebml::EbmlElement::SkipData
                  (pEVar3,pEVar1,*(EbmlSemanticContext **)(CONCAT44(extraout_var_06,iVar2) + 0x18),
                   (EbmlElement *)0x0,false);
        if (*this_00 != (EbmlElement *)0x0) {
          (*(*this_00)->_vptr_EbmlElement[1])();
        }
        pEVar1 = this->aStream;
        iVar2 = (*this->m_element1->_vptr_EbmlElement[4])();
        pEVar3 = libebml::EbmlStream::FindNextElement
                           (pEVar1,*(EbmlSemanticContext **)(CONCAT44(extraout_var_07,iVar2) + 0x18)
                            ,UpperLevel,0xffffffff,this->m_allowDummy,1);
        this->m_element2a = pEVar3;
      }
      else {
        *UpperLevel = *UpperLevel + -1;
        if (*this_00 != (EbmlElement *)0x0) {
          (*(*this_00)->_vptr_EbmlElement[1])();
        }
        pEVar3 = this->m_element3a;
        this->m_element2a = pEVar3;
        if (0 < this->m_upperElementa) break;
      }
      if ((pEVar3 == (EbmlElement *)0x0) || (iVar2 = *UpperLevel, 0 < iVar2)) break;
    } while( true );
  }
  fputc(10,_stderr);
  return;
}

Assistant:

void MkvInterface::handleInfo()
{
    m_element2a = aStream->FindNextElement(m_element1->Generic().Context, m_upperElementa, 0xFFFFFFFFL, m_allowDummy);
    
    while (m_element2a != NULL) 
    {
        if (m_upperElementa > 0)
            break;
        if (m_upperElementa < 0)
            m_upperElementa = 0;
    
        //fprintf(stderr, "\tFILE POS = %d, ELEMENT POS = %d\n", m_file->getFilePointer(), m_element2a->GetElementPosition());
        
        if (m_verbose)
        {
            fprintf(stderr, "\tEBML ID: ");
            for (unsigned int i=0; i<EbmlId(*m_element2a).Length; i++)
                fprintf(stderr, "[%02X]", (EbmlId(*m_element2a).Value >> (8*(1-i))) & 0xFF);
            fprintf(stderr, "\n");
        }
        
        if (EbmlId(*m_element2a) == KaxTimecodeScale::ClassInfos.GlobalId)
        {
            KaxTimecodeScale *TimeScale = static_cast<KaxTimecodeScale*>(m_element2a);
            TimeScale->ReadData(aStream->I_O());
            fprintf(stderr, "\tTimecode Scale : %d\n", uint32(*TimeScale));
        }
        else if (EbmlId(*m_element2a) == KaxDuration::ClassInfos.GlobalId)
        {
            KaxDuration *Duration = static_cast<KaxDuration*>(m_element2a);
            Duration->ReadData(aStream->I_O());
            m_duration = Duration->GetValue();
            fprintf(stderr, "\tSegment duration : %0.2fs\n", 1000*m_duration/TIMECODE_SCALE);
        }
        else if (EbmlId(*m_element2a) == KaxDateUTC::ClassInfos.GlobalId)
        {
            fprintf(stderr, "\tDate UTC\n");
        }
        else if (EbmlId(*m_element2a) == KaxSegmentFilename::ClassInfos.GlobalId)
        {
            KaxSegmentFilename *fn = static_cast<KaxSegmentFilename*>(m_element2a);
            fn->ReadData(aStream->I_O());
            fprintf(stderr, "\tSegment filename : %s\n", UTFstring(*fn).GetUTF8().c_str());
        }
        else if (EbmlId(*m_element2a) == KaxMuxingApp::ClassInfos.GlobalId)
        {
            KaxMuxingApp *pApp = static_cast<KaxMuxingApp*>(m_element2a);
            pApp->ReadData(aStream->I_O());
            fprintf(stderr, "\tMuxing app : %s\n", UTFstring(*pApp).GetUTF8().c_str());
        }
        else if (EbmlId(*m_element2a) == KaxWritingApp::ClassInfos.GlobalId)
        {
            KaxWritingApp *pApp = static_cast<KaxWritingApp*>(m_element2a);
            pApp->ReadData(aStream->I_O());
            fprintf(stderr, "\tWriting app : %s\n", UTFstring(*pApp).GetUTF8().c_str());
        }
        else
        {
            fprintf(stderr, "\tOther...\n");
        }
        
        if (m_upperElementa > 0)
        {
            m_upperElementa--;
            delete m_element2a;
            m_element2a = m_element3a;
            if (m_upperElementa > 0)
                break;
        } 
        else
        {
            m_element2a->SkipData(*aStream, m_element2a->Generic().Context);
            delete m_element2a;

            m_element2a = aStream->FindNextElement(m_element1->Generic().Context, m_upperElementa, 0xFFFFFFFFL, m_allowDummy);
        }
    }
    fprintf(stderr, "\n");
}